

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_absolute_location_path(lyxp_expr *exp,uint16_t *exp_idx)

{
  lyxp_token lVar1;
  int iVar2;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  iVar2 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_PATH,1);
  if (iVar2 != 0) {
    return -1;
  }
  if (exp->tok_len[*exp_idx] == '\x01') {
    *exp_idx = *exp_idx + 1;
    iVar2 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_NONE,0);
    if (iVar2 != 0) {
      return 0;
    }
    lVar1 = exp->tokens[*exp_idx];
    if (((lVar1 - LYXP_TOKEN_DOT < 3) ||
        (lVar1 == LYXP_TOKEN_NAMETEST || lVar1 == LYXP_TOKEN_NODETYPE)) &&
       (iVar2 = reparse_relative_location_path(exp,exp_idx), iVar2 != 0)) {
      return -1;
    }
  }
  else {
    *exp_idx = *exp_idx + 1;
    iVar2 = reparse_relative_location_path(exp,exp_idx);
    if (iVar2 != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
reparse_absolute_location_path(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_PATH, 1)) {
        return -1;
    }

    /* '/' RelativeLocationPath? */
    if (exp->tok_len[*exp_idx] == 1) {
        /* '/' */
        ++(*exp_idx);

        if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_NONE, 0)) {
            return EXIT_SUCCESS;
        }
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
        case LYXP_TOKEN_DDOT:
        case LYXP_TOKEN_AT:
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            if (reparse_relative_location_path(exp, exp_idx)) {
                return -1;
            }
            /* fall through */
        default:
            break;
        }

    /* '//' RelativeLocationPath */
    } else {
        /* '//' */
        ++(*exp_idx);

        if (reparse_relative_location_path(exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}